

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void CopyInputToRingBuffer(BrotliEncoderState *s,size_t input_size,uint8_t *input_buffer)

{
  MemoryManager *m;
  uint uVar1;
  uint8_t *puVar2;
  long lVar3;
  size_t __n;
  ulong uVar4;
  uint8_t *puVar5;
  uint uVar6;
  uint32_t uVar9;
  uint32_t uVar7;
  ulong uVar8;
  
  EnsureInitialized(s);
  m = &s->memory_manager_;
  uVar7 = (s->ringbuffer_).pos_;
  uVar9 = (uint32_t)input_size;
  if ((uVar7 == 0) && (input_size < (s->ringbuffer_).tail_size_)) {
    (s->ringbuffer_).pos_ = uVar9;
    puVar2 = (uint8_t *)BrotliAllocate(m,(ulong)(uVar9 + 2) + 7);
    puVar5 = (s->ringbuffer_).data_;
    if (puVar5 != (uint8_t *)0x0) {
      memcpy(puVar2,puVar5,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
      BrotliFree(m,(s->ringbuffer_).data_);
    }
    (s->ringbuffer_).data_ = puVar2;
    (s->ringbuffer_).cur_size_ = uVar9;
    (s->ringbuffer_).buffer_ = puVar2 + 2;
    puVar2[1] = '\0';
    (s->ringbuffer_).buffer_[-2] = '\0';
    for (lVar3 = 0; puVar5 = (s->ringbuffer_).buffer_, lVar3 != 7; lVar3 = lVar3 + 1) {
      puVar5[lVar3 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
    }
    memcpy(puVar5,input_buffer,input_size);
    uVar1 = (s->ringbuffer_).pos_;
  }
  else {
    uVar1 = (s->ringbuffer_).total_size_;
    if ((s->ringbuffer_).cur_size_ < uVar1) {
      puVar2 = (uint8_t *)BrotliAllocate(m,(ulong)(uVar1 + 2) + 7);
      puVar5 = (s->ringbuffer_).data_;
      if (puVar5 != (uint8_t *)0x0) {
        memcpy(puVar2,puVar5,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
        BrotliFree(m,(s->ringbuffer_).data_);
      }
      (s->ringbuffer_).data_ = puVar2;
      (s->ringbuffer_).cur_size_ = uVar1;
      (s->ringbuffer_).buffer_ = puVar2 + 2;
      puVar2[1] = '\0';
      (s->ringbuffer_).buffer_[-2] = '\0';
      for (lVar3 = 0; puVar5 = (s->ringbuffer_).buffer_, lVar3 != 7; lVar3 = lVar3 + 1) {
        puVar5[lVar3 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
      }
      puVar5[(s->ringbuffer_).size_ - 2] = '\0';
      (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
      uVar7 = (s->ringbuffer_).pos_;
    }
    uVar6 = uVar7 & (s->ringbuffer_).mask_;
    uVar8 = (ulong)uVar6;
    uVar1 = (s->ringbuffer_).tail_size_;
    if (uVar6 < uVar1) {
      uVar4 = uVar1 - uVar8;
      if (input_size < uVar4) {
        uVar4 = input_size;
      }
      memcpy((s->ringbuffer_).buffer_ + uVar8 + (s->ringbuffer_).size_,input_buffer,uVar4);
    }
    puVar5 = (s->ringbuffer_).buffer_ + uVar8;
    __n = input_size;
    if ((ulong)(s->ringbuffer_).size_ < input_size + uVar8) {
      uVar4 = (s->ringbuffer_).total_size_ - uVar8;
      if (input_size < uVar4) {
        uVar4 = input_size;
      }
      memcpy(puVar5,input_buffer,uVar4);
      puVar5 = (s->ringbuffer_).buffer_;
      lVar3 = (s->ringbuffer_).size_ - uVar8;
      input_buffer = input_buffer + lVar3;
      __n = input_size - lVar3;
    }
    memcpy(puVar5,input_buffer,__n);
    puVar5 = (s->ringbuffer_).buffer_;
    puVar5[-2] = puVar5[(s->ringbuffer_).size_ - 2];
    puVar5 = (s->ringbuffer_).buffer_;
    puVar5[-1] = puVar5[(s->ringbuffer_).size_ - 1];
    uVar1 = (s->ringbuffer_).pos_ + uVar9;
    (s->ringbuffer_).pos_ = uVar1;
    if (0x40000000 < uVar1) {
      uVar1 = uVar1 & 0x3fffffff | 0x40000000;
      (s->ringbuffer_).pos_ = uVar1;
    }
  }
  s->input_pos_ = s->input_pos_ + input_size;
  if (uVar1 <= (s->ringbuffer_).mask_) {
    puVar5 = (s->ringbuffer_).buffer_;
    puVar2 = puVar5 + (ulong)uVar1 + 3;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar5 = puVar5 + uVar1;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
  }
  return;
}

Assistant:

static void CopyInputToRingBuffer(BrotliEncoderState* s,
                                  const size_t input_size,
                                  const uint8_t* input_buffer) {
  RingBuffer* ringbuffer_ = &s->ringbuffer_;
  MemoryManager* m = &s->memory_manager_;
  if (!EnsureInitialized(s)) return;
  RingBufferWrite(m, input_buffer, input_size, ringbuffer_);
  if (BROTLI_IS_OOM(m)) return;
  s->input_pos_ += input_size;

  /* TL;DR: If needed, initialize 7 more bytes in the ring buffer to make the
     hashing not depend on uninitialized data. This makes compression
     deterministic and it prevents uninitialized memory warnings in Valgrind.
     Even without erasing, the output would be valid (but nondeterministic).

     Background information: The compressor stores short (at most 8 bytes)
     substrings of the input already read in a hash table, and detects
     repetitions by looking up such substrings in the hash table. If it
     can find a substring, it checks whether the substring is really there
     in the ring buffer (or it's just a hash collision). Should the hash
     table become corrupt, this check makes sure that the output is
     still valid, albeit the compression ratio would be bad.

     The compressor populates the hash table from the ring buffer as it's
     reading new bytes from the input. However, at the last few indexes of
     the ring buffer, there are not enough bytes to build full-length
     substrings from. Since the hash table always contains full-length
     substrings, we erase with dummy zeros here to make sure that those
     substrings will contain zeros at the end instead of uninitialized
     data.

     Please note that erasing is not necessary (because the
     memory region is already initialized since he ring buffer
     has a `tail' that holds a copy of the beginning,) so we
     skip erasing if we have already gone around at least once in
     the ring buffer.

     Only clear during the first round of ring-buffer writes. On
     subsequent rounds data in the ring-buffer would be affected. */
  if (ringbuffer_->pos_ <= ringbuffer_->mask_) {
    /* This is the first time when the ring buffer is being written.
       We clear 7 bytes just after the bytes that have been copied from
       the input buffer.

       The ring-buffer has a "tail" that holds a copy of the beginning,
       but only once the ring buffer has been fully written once, i.e.,
       pos <= mask. For the first time, we need to write values
       in this tail (where index may be larger than mask), so that
       we have exactly defined behavior and don't read uninitialized
       memory. Due to performance reasons, hashing reads data using a
       LOAD64, which can go 7 bytes beyond the bytes written in the
       ring-buffer. */
    memset(ringbuffer_->buffer_ + ringbuffer_->pos_, 0, 7);
  }
}